

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void leaveblock(FuncState *fs)

{
  byte bVar1;
  int iVar2;
  LexState *pLVar3;
  BlockCnt *pBVar4;
  FuncState *pFVar5;
  LocVar *pLVar6;
  long lVar7;
  FuncState *fs_1;
  ulong uVar8;
  
  pLVar3 = fs->ls;
  pBVar4 = fs->bl;
  fs->bl = pBVar4->previous;
  bVar1 = pBVar4->nactvar;
  pFVar5 = pLVar3->fs;
  uVar8 = (ulong)pFVar5->nactvar;
  if (bVar1 < pFVar5->nactvar) {
    iVar2 = pFVar5->pc;
    pLVar6 = pFVar5->f->locvars;
    do {
      lVar7 = uVar8 + 0x3b;
      uVar8 = uVar8 - 1;
      pLVar6[*(ushort *)&pFVar5->upvalues[lVar7].info].endpc = iVar2;
    } while (bVar1 < uVar8);
    pFVar5->nactvar = (lu_byte)uVar8;
  }
  if (pBVar4->upval != '\0') {
    luaK_code(fs,(uint)bVar1 << 6 | 0x23,pLVar3->lastline);
  }
  fs->freereg = (uint)fs->nactvar;
  iVar2 = pBVar4->breaklist;
  fs->lasttarget = fs->pc;
  luaK_concat(fs,&fs->jpc,iVar2);
  return;
}

Assistant:

static void leaveblock(FuncState*fs){
BlockCnt*bl=fs->bl;
fs->bl=bl->previous;
removevars(fs->ls,bl->nactvar);
if(bl->upval)
luaK_codeABC(fs,OP_CLOSE,bl->nactvar,0,0);
fs->freereg=fs->nactvar;
luaK_patchtohere(fs,bl->breaklist);
}